

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O3

unique_ptr<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>_> __thiscall
lunasvg::SVGElement::create(SVGElement *this,Document *document,ElementID id)

{
  pointer __p_4;
  SVGPolyElement *this_00;
  SVGGraphicsElement *pSVar1;
  SVGMaskElement *this_01;
  SVGClipPathElement *this_02;
  _func_int **pp_Var2;
  SVGTSpanElement *this_03;
  SVGMarkerElement *this_04;
  SVGTextElement *this_05;
  SVGSymbolElement *this_06;
  SVGStopElement *this_07;
  undefined7 in_register_00000011;
  pointer __p;
  __uniq_ptr_impl<lunasvg::SVGGElement,_std::default_delete<lunasvg::SVGGElement>_> local_28;
  
  switch((int)CONCAT71(in_register_00000011,id)) {
  case 2:
    this_05 = (SVGTextElement *)operator_new(0x160);
    SVGCircleElement::SVGCircleElement((SVGCircleElement *)this_05,document);
    break;
  case 3:
    this_02 = (SVGClipPathElement *)operator_new(0xa8);
    SVGClipPathElement::SVGClipPathElement(this_02,document);
    local_28._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>.
    super__Head_base<0UL,_lunasvg::SVGGElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)0x0;
    (this->super_SVGNode)._vptr_SVGNode = (_func_int **)this_02;
    std::unique_ptr<lunasvg::SVGClipPathElement,_std::default_delete<lunasvg::SVGClipPathElement>_>
    ::~unique_ptr((unique_ptr<lunasvg::SVGClipPathElement,_std::default_delete<lunasvg::SVGClipPathElement>_>
                   *)&local_28);
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 4:
    pSVar1 = (SVGGraphicsElement *)operator_new(0x98);
    SVGGraphicsElement::SVGGraphicsElement(pSVar1,document,Defs);
    (pSVar1->super_SVGElement).super_SVGNode._vptr_SVGNode =
         (_func_int **)&PTR__SVGGraphicsElement_00159170;
    local_28._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>.
    super__Head_base<0UL,_lunasvg::SVGGElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)0x0;
    (this->super_SVGNode)._vptr_SVGNode = (_func_int **)pSVar1;
    std::unique_ptr<lunasvg::SVGDefsElement,_std::default_delete<lunasvg::SVGDefsElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGDefsElement,_std::default_delete<lunasvg::SVGDefsElement>_>
                 *)&local_28);
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 5:
    this_05 = (SVGTextElement *)operator_new(0x178);
    SVGEllipseElement::SVGEllipseElement((SVGEllipseElement *)this_05,document);
    break;
  case 6:
    pSVar1 = (SVGGraphicsElement *)operator_new(0x98);
    SVGGraphicsElement::SVGGraphicsElement(pSVar1,document,G);
    (pSVar1->super_SVGElement).super_SVGNode._vptr_SVGNode =
         (_func_int **)&PTR__SVGGraphicsElement_00158c78;
    local_28._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>.
    super__Head_base<0UL,_lunasvg::SVGGElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)0x0;
    (this->super_SVGNode)._vptr_SVGNode = (_func_int **)pSVar1;
    std::unique_ptr<lunasvg::SVGGElement,_std::default_delete<lunasvg::SVGGElement>_>::~unique_ptr
              ((unique_ptr<lunasvg::SVGGElement,_std::default_delete<lunasvg::SVGGElement>_> *)
               &local_28);
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 7:
    this_05 = (SVGTextElement *)operator_new(0x118);
    SVGImageElement::SVGImageElement((SVGImageElement *)this_05,document);
    break;
  case 8:
    this_05 = (SVGTextElement *)operator_new(0x178);
    SVGLineElement::SVGLineElement((SVGLineElement *)this_05,document);
    break;
  case 9:
    this_05 = (SVGTextElement *)operator_new(0x148);
    SVGLinearGradientElement::SVGLinearGradientElement((SVGLinearGradientElement *)this_05,document)
    ;
    break;
  case 10:
    this_04 = (SVGMarkerElement *)operator_new(0x130);
    SVGMarkerElement::SVGMarkerElement(this_04,document);
    local_28._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>.
    super__Head_base<0UL,_lunasvg::SVGGElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)0x0;
    (this->super_SVGNode)._vptr_SVGNode = (_func_int **)this_04;
    std::unique_ptr<lunasvg::SVGMarkerElement,_std::default_delete<lunasvg::SVGMarkerElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGMarkerElement,_std::default_delete<lunasvg::SVGMarkerElement>_>
                 *)&local_28);
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 0xb:
    this_01 = (SVGMaskElement *)operator_new(0xf8);
    SVGMaskElement::SVGMaskElement(this_01,document);
    local_28._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>.
    super__Head_base<0UL,_lunasvg::SVGGElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)0x0;
    (this->super_SVGNode)._vptr_SVGNode = (_func_int **)this_01;
    std::unique_ptr<lunasvg::SVGMaskElement,_std::default_delete<lunasvg::SVGMaskElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGMaskElement,_std::default_delete<lunasvg::SVGMaskElement>_>
                 *)&local_28);
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 0xc:
    this_05 = (SVGTextElement *)operator_new(0x130);
    SVGPathElement::SVGPathElement((SVGPathElement *)this_05,document);
    break;
  case 0xd:
    this_05 = (SVGTextElement *)operator_new(0x180);
    SVGPatternElement::SVGPatternElement((SVGPatternElement *)this_05,document);
    break;
  case 0xe:
  case 0xf:
    this_00 = (SVGPolyElement *)operator_new(0x140);
    SVGPolyElement::SVGPolyElement(this_00,document,id);
    (this->super_SVGNode)._vptr_SVGNode = (_func_int **)this_00;
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 0x10:
    this_05 = (SVGTextElement *)operator_new(0x160);
    SVGRadialGradientElement::SVGRadialGradientElement((SVGRadialGradientElement *)this_05,document)
    ;
    break;
  case 0x11:
    this_05 = (SVGTextElement *)operator_new(0x1a8);
    SVGRectElement::SVGRectElement((SVGRectElement *)this_05,document);
    break;
  case 0x12:
    this_07 = (SVGStopElement *)operator_new(0x88);
    SVGStopElement::SVGStopElement(this_07,document);
    local_28._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>.
    super__Head_base<0UL,_lunasvg::SVGGElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)0x0;
    (this->super_SVGNode)._vptr_SVGNode = (_func_int **)this_07;
    std::unique_ptr<lunasvg::SVGStopElement,_std::default_delete<lunasvg::SVGStopElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGStopElement,_std::default_delete<lunasvg::SVGStopElement>_>
                 *)&local_28);
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 0x13:
    pp_Var2 = (_func_int **)operator_new(0x70);
    pp_Var2[1] = (_func_int *)document;
    pp_Var2[2] = (_func_int *)0x0;
    pp_Var2[3] = (_func_int *)0;
    pp_Var2[4] = (_func_int *)0xbf800000bf800000;
    pp_Var2[5] = (_func_int *)0x0;
    pp_Var2[6] = (_func_int *)0x0;
    pp_Var2[7] = (_func_int *)0x414000003f800000;
    *(undefined4 *)(pp_Var2 + 8) = 0x13000000;
    pp_Var2[9] = (_func_int *)0x0;
    pp_Var2[10] = (_func_int *)0x0;
    pp_Var2[0xc] = (_func_int *)(pp_Var2 + 0xb);
    pp_Var2[0xb] = (_func_int *)(pp_Var2 + 0xb);
    pp_Var2[0xd] = (_func_int *)0x0;
    *pp_Var2 = (_func_int *)&PTR__SVGElement_00158f90;
    local_28._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>.
    super__Head_base<0UL,_lunasvg::SVGGElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)0x0;
    (this->super_SVGNode)._vptr_SVGNode = pp_Var2;
    std::unique_ptr<lunasvg::SVGStyleElement,_std::default_delete<lunasvg::SVGStyleElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGStyleElement,_std::default_delete<lunasvg::SVGStyleElement>_>
                 *)&local_28);
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 0x14:
    this_05 = (SVGTextElement *)operator_new(0x130);
    SVGSVGElement::SVGSVGElement((SVGSVGElement *)this_05,document);
    break;
  case 0x15:
    this_06 = (SVGSymbolElement *)operator_new(0xd0);
    SVGSymbolElement::SVGSymbolElement(this_06,document);
    local_28._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>.
    super__Head_base<0UL,_lunasvg::SVGGElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)0x0;
    (this->super_SVGNode)._vptr_SVGNode = (_func_int **)this_06;
    std::unique_ptr<lunasvg::SVGSymbolElement,_std::default_delete<lunasvg::SVGSymbolElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGSymbolElement,_std::default_delete<lunasvg::SVGSymbolElement>_>
                 *)&local_28);
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 0x16:
    this_05 = (SVGTextElement *)operator_new(0x200);
    SVGTextElement::SVGTextElement(this_05,document);
    break;
  case 0x17:
    this_03 = (SVGTSpanElement *)operator_new(0x1c8);
    SVGTSpanElement::SVGTSpanElement(this_03,document);
    local_28._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>.
    super__Head_base<0UL,_lunasvg::SVGGElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGGElement_*,_std::default_delete<lunasvg::SVGGElement>_>)0x0;
    (this->super_SVGNode)._vptr_SVGNode = (_func_int **)this_03;
    std::unique_ptr<lunasvg::SVGTSpanElement,_std::default_delete<lunasvg::SVGTSpanElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGTSpanElement,_std::default_delete<lunasvg::SVGTSpanElement>_>
                 *)&local_28);
    return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
            )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
              )this;
  case 0x18:
    this_05 = (SVGTextElement *)operator_new(0x128);
    SVGUseElement::SVGUseElement((SVGUseElement *)this_05,document);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgelement.cpp"
                  ,0x76,
                  "static std::unique_ptr<SVGElement> lunasvg::SVGElement::create(Document *, ElementID)"
                 );
  }
  (this->super_SVGNode)._vptr_SVGNode = (_func_int **)this_05;
  return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
         )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<SVGElement> SVGElement::create(Document* document, ElementID id)
{
    switch(id) {
    case ElementID::Svg:
        return std::make_unique<SVGSVGElement>(document);
    case ElementID::Path:
        return std::make_unique<SVGPathElement>(document);
    case ElementID::G:
        return std::make_unique<SVGGElement>(document);
    case ElementID::Rect:
        return std::make_unique<SVGRectElement>(document);
    case ElementID::Circle:
        return std::make_unique<SVGCircleElement>(document);
    case ElementID::Ellipse:
        return std::make_unique<SVGEllipseElement>(document);
    case ElementID::Line:
        return std::make_unique<SVGLineElement>(document);
    case ElementID::Defs:
        return std::make_unique<SVGDefsElement>(document);
    case ElementID::Polygon:
    case ElementID::Polyline:
        return std::make_unique<SVGPolyElement>(document, id);
    case ElementID::Stop:
        return std::make_unique<SVGStopElement>(document);
    case ElementID::LinearGradient:
        return std::make_unique<SVGLinearGradientElement>(document);
    case ElementID::RadialGradient:
        return std::make_unique<SVGRadialGradientElement>(document);
    case ElementID::Symbol:
        return std::make_unique<SVGSymbolElement>(document);
    case ElementID::Use:
        return std::make_unique<SVGUseElement>(document);
    case ElementID::Pattern:
        return std::make_unique<SVGPatternElement>(document);
    case ElementID::Mask:
        return std::make_unique<SVGMaskElement>(document);
    case ElementID::ClipPath:
        return std::make_unique<SVGClipPathElement>(document);
    case ElementID::Marker:
        return std::make_unique<SVGMarkerElement>(document);
    case ElementID::Image:
        return std::make_unique<SVGImageElement>(document);
    case ElementID::Style:
        return std::make_unique<SVGStyleElement>(document);
    case ElementID::Text:
        return std::make_unique<SVGTextElement>(document);
    case ElementID::Tspan:
        return std::make_unique<SVGTSpanElement>(document);
    default:
        assert(false);
    }

    return nullptr;
}